

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall pbrt::Vertex::f(Vertex *this,Vertex *next,TransportMode mode)

{
  float fVar1;
  undefined1 auVar2 [16];
  Float c;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  SampledSpectrum SVar8;
  Point3f PVar9;
  Point3f PVar10;
  Vector3<float> wi;
  Tuple3<pbrt::Vector3,_float> local_48;
  undefined1 local_38 [16];
  SampledSpectrum local_28;
  
  auVar7 = in_ZMM0._8_56_;
  PVar9 = Interaction::p(&(next->field_2).ei.super_Interaction);
  auVar4._0_8_ = PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar7;
  local_38 = auVar4._0_16_;
  PVar10 = Interaction::p(&(this->field_2).ei.super_Interaction);
  auVar5._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar7;
  auVar2 = vsubps_avx(local_38,auVar5._0_16_);
  local_48._0_8_ = vmovlps_avx(auVar2);
  auVar3._0_4_ = auVar2._0_4_ * auVar2._0_4_;
  auVar3._4_4_ = auVar2._4_4_ * auVar2._4_4_;
  auVar3._8_4_ = auVar2._8_4_ * auVar2._8_4_;
  auVar3._12_4_ = auVar2._12_4_ * auVar2._12_4_;
  auVar2 = vhaddps_avx(auVar3,auVar3);
  local_48.z = PVar9.super_Tuple3<pbrt::Point3,_float>.z -
               PVar10.super_Tuple3<pbrt::Point3,_float>.z;
  fVar1 = local_48.z * local_48.z + auVar2._0_4_;
  auVar7 = ZEXT456(0);
  if ((fVar1 != 0.0) ||
     (SVar8.values.values = (array<float,_4>)(array<float,_4>)ZEXT816(0), NAN(fVar1))) {
    wi = Normalize<float>((Vector3<float> *)&local_48);
    local_48.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    local_48._0_8_ = vmovlps_avx(auVar6._0_16_);
    if (this->type == Medium) {
      c = PhaseFunctionHandle::p
                    (&(this->field_2).mi.phase,
                     (Vector3f)*(Tuple3<pbrt::Vector3,_float> *)((long)&this->field_2 + 0x1c),
                     (Vector3f)wi.super_Tuple3<pbrt::Vector3,_float>);
      SampledSpectrum::SampledSpectrum(&local_28,c);
      SVar8.values.values = local_28.values.values;
    }
    else {
      if (this->type != Surface) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                 ,0x662,"Vertex::f(): Unimplemented");
      }
      SVar8 = BSDF::f(&this->bsdf,
                      (Vector3f)*(Tuple3<pbrt::Vector3,_float> *)((long)&this->field_2 + 0x1c),
                      (Vector3f)wi.super_Tuple3<pbrt::Vector3,_float>,mode);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar8;
}

Assistant:

SampledSpectrum f(const Vertex &next, TransportMode mode) const {
        Vector3f wi = next.p() - p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);
        switch (type) {
        case VertexType::Surface:
            return bsdf.f(si.wo, wi, mode);
        case VertexType::Medium:
            return SampledSpectrum(mi.phase.p(mi.wo, wi));
        default:
            LOG_FATAL("Vertex::f(): Unimplemented");
            return SampledSpectrum(0.f);
        }
    }